

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_stat.cpp
# Opt level: O0

vector<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
* __thiscall
csv::CSVStat::get_dtypes
          (vector<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
           *__return_storage_ptr__,CSVStat *this)

{
  ulong uVar1;
  size_type sVar2;
  const_reference __x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  ulong local_28;
  size_t i;
  CSVStat *local_18;
  CSVStat *this_local;
  vector<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
  *ret;
  
  i._7_1_ = 0;
  local_18 = this;
  this_local = (CSVStat *)__return_storage_ptr__;
  std::
  vector<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
  ::vector(__return_storage_ptr__);
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    get_col_names_abi_cxx11_(&local_40,this);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
    if (sVar2 <= uVar1) break;
    __x = std::
          vector<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
          ::operator[](&this->dtypes,local_28);
    std::
    vector<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
    ::push_back(__return_storage_ptr__,__x);
    local_28 = local_28 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE std::vector<CSVStat::TypeCount> CSVStat::get_dtypes() const {
        std::vector<TypeCount> ret;        
        for (size_t i = 0; i < this->get_col_names().size(); i++) {
            ret.push_back(this->dtypes[i]);
        }
        return ret;
    }